

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.cpp
# Opt level: O3

bool ReadDSC(MemFile *file,shared_ptr<Disk> *disk)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  exception *peVar7;
  ssize_t sVar8;
  Header *__nbytes;
  size_t __nbytes_00;
  uint sector_00;
  MemFile *pMVar9;
  uint uVar10;
  int iVar11;
  DSC_TRACK dh;
  DSC_SECTOR ds;
  CylHead cylhead;
  DSC_DATA dd;
  Data data;
  int offset;
  string strPath;
  Sector sector;
  MemFile file2;
  Track track;
  byte local_16c;
  byte local_16b;
  byte local_16a;
  byte local_169;
  byte local_168;
  byte local_167;
  byte local_166;
  value_type local_165;
  CylHead local_164;
  byte local_15b;
  ushort local_15a;
  MemFile *local_158;
  undefined8 local_150;
  Header local_148;
  long local_138;
  uint local_12c;
  shared_ptr<Disk> *local_128;
  string local_120;
  undefined1 local_100 [40];
  vector<Data,_std::allocator<Data>_> local_d8;
  MemFile *local_c0;
  MemFile local_b8;
  Track local_50;
  
  local_128 = disk;
  MemFile::rewind(file,(FILE *)disk);
  psVar6 = MemFile::path_abi_cxx11_(file);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + psVar6->_M_string_length);
  local_b8.m_path._M_dataplus._M_p = (pointer)&local_b8.m_path.field_2;
  local_b8.m_path._M_string_length = 0;
  local_b8.m_path.field_2._M_local_buf[0] = '\0';
  local_b8.m_filename._M_dataplus._M_p = (pointer)&local_b8.m_filename.field_2;
  local_b8.m_filename._M_string_length = 0;
  local_b8.m_filename.field_2._M_local_buf[0] = '\0';
  local_b8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.m_it._M_current = (uchar *)0x0;
  local_b8.m_compress = None;
  pcVar1 = local_100 + 0x10;
  local_100._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"hdr","");
  bVar3 = IsFileExt(&local_120,(string *)local_100);
  if ((pointer)local_100._0_8_ != pcVar1) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if (bVar3) {
    local_120._M_dataplus._M_p[local_120._M_string_length - 3] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 3] & 0x20U | 0x44;
    local_120._M_dataplus._M_p[local_120._M_string_length - 2] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 2] & 0x20U | 0x53;
    local_120._M_dataplus._M_p[local_120._M_string_length - 1] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 1] & 0x20U | 0x43;
    local_158 = &local_b8;
    iVar4 = MemFile::open(local_158,(char *)&local_120,1);
    __nbytes_00 = local_120._M_string_length;
    pMVar9 = file;
    if ((char)iVar4 == '\0') {
      peVar7 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar7,(char (*) [28])"missing .dsc companion file");
      __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    local_100._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"dsc","");
    bVar3 = IsFileExt(&local_120,(string *)local_100);
    if ((pointer)local_100._0_8_ != pcVar1) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0018bcd3;
    }
    local_120._M_dataplus._M_p[local_120._M_string_length - 3] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 3] & 0x20U | 0x48;
    local_120._M_dataplus._M_p[local_120._M_string_length - 2] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 2] & 0x20U | 0x44;
    local_120._M_dataplus._M_p[local_120._M_string_length - 1] =
         local_120._M_dataplus._M_p[local_120._M_string_length - 1] & 0x20U | 0x52;
    pMVar9 = &local_b8;
    iVar4 = MemFile::open(pMVar9,(char *)&local_120,1);
    __nbytes_00 = local_120._M_string_length;
    local_158 = file;
    if ((char)iVar4 == '\0') {
      peVar7 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (peVar7,(char (*) [28])"missing .hdr companion file");
      __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_c0 = pMVar9;
  while (sVar8 = MemFile::read(pMVar9,(int)&local_16c,(void *)0x2,__nbytes_00), (char)sVar8 != '\0')
  {
    Track::Track(&local_50,0);
    CylHead::CylHead(&local_164,(uint)(local_16c >> 1),local_16c & 1);
    if (local_16b != 0) {
      sector_00 = 0;
      do {
        sVar8 = MemFile::read(pMVar9,(int)&local_16a,(void *)0x6,1);
        if ((int)sVar8 == 0) {
          peVar7 = (exception *)__cxa_allocate_exception(0x10);
          local_100._0_8_ = CHS(local_164.cyl,local_164.head,sector_00);
          util::exception::exception<char_const(&)[22],char_const*>
                    (peVar7,(char (*) [22])"short file reading %s",(char **)local_100);
          __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        Header::Header(&local_148,(uint)local_16a,(uint)local_169,(uint)local_168,(uint)local_167);
        Sector::Sector((Sector *)local_100,_250K,MFM,&local_148,0);
        __nbytes = (Header *)(ulong)(local_166 & 0xfd);
        if ((local_166 & 0xfd) != 0) {
          local_150 = (char *)(CONCAT44(local_150._4_4_,(uint)local_166) & 0xffffffff000000fd);
          local_148._0_8_ = CHSR(local_164.cyl,local_164.head,sector_00,(uint)local_168);
          __nbytes = &local_148;
          Message<int,char_const*>
                    (msgWarning,"unknown flags [%02X] for %s",(int *)&local_150,(char **)&local_148)
          ;
        }
        if ((local_166 & 2) == 0) {
          sVar8 = MemFile::read(pMVar9,(int)&local_15b,(void *)0x3,(size_t)__nbytes);
          if ((char)sVar8 == '\0') {
            peVar7 = (exception *)__cxa_allocate_exception(0x10);
            local_148._0_8_ = CHSR(local_164.cyl,local_164.head,sector_00,local_100._8_4_);
            util::exception::exception<char_const(&)[20],char_const*>
                      (peVar7,(char (*) [20])"short file reading ",(char **)&local_148);
            __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar10 = (uint)local_15b << 8 | (uint)local_15a << 0x10;
          local_12c = uVar10;
          uVar5 = MemFile::tell(local_158);
          if (uVar10 != uVar5) {
            iVar4 = MemFile::tell(local_158);
            local_148.cyl = iVar4;
            Message<int&,int>(msgWarning,"header offset (%lu) != data pointer (%lu)",
                              (int *)&local_12c,&local_148.cyl);
          }
          iVar4 = Sector::size((Sector *)local_100);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,(long)iVar4
                     ,(allocator_type *)&local_150);
          iVar11 = local_148.sector - local_148.cyl;
          iVar4 = MemFile::remaining(local_158);
          pMVar9 = local_158;
          if (iVar4 < iVar11) {
            peVar7 = (exception *)__cxa_allocate_exception(0x10);
            local_150 = CHSR(local_164.cyl,local_164.head,sector_00,local_100._8_4_);
            util::exception::exception<char_const(&)[27],char_const*>
                      (peVar7,(char (*) [27])"short file reading %s data",(char **)&local_150);
            __cxa_throw(peVar7,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy((void *)local_148._0_8_,(local_158->m_it)._M_current,(long)iVar11);
          (pMVar9->m_it)._M_current = (pMVar9->m_it)._M_current + iVar11;
          __nbytes_00 = 0xfb;
          Sector::add((Sector *)local_100,(Data *)&local_148,false,0xfb);
          pMVar9 = local_c0;
          if ((char *)local_148._0_8_ != (char *)0x0) {
            operator_delete((void *)local_148._0_8_,local_138 - local_148._0_8_);
            pMVar9 = local_c0;
          }
        }
        else {
          iVar4 = Sector::size((Sector *)local_100);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,(long)iVar4
                     ,&local_165,(allocator_type *)&local_150);
          __nbytes_00 = 0xfb;
          Sector::add((Sector *)local_100,(Data *)&local_148,false,0xfb);
          if ((char *)local_148._0_8_ != (char *)0x0) {
            operator_delete((void *)local_148._0_8_,local_138 - local_148._0_8_);
          }
        }
        Track::add(&local_50,(Sector *)local_100);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_d8);
        sector_00 = sector_00 + 1;
      } while (sector_00 < local_16b);
    }
    Disk::write((local_128->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                (int)&local_164,&local_50,__nbytes_00);
    std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_50.m_sectors);
  }
  peVar2 = (local_128->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar3 = true;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b0d8f);
LAB_0018bcd3:
  if (local_b8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_filename._M_dataplus._M_p != &local_b8.m_filename.field_2) {
    operator_delete(local_b8.m_filename._M_dataplus._M_p,
                    CONCAT71(local_b8.m_filename.field_2._M_allocated_capacity._1_7_,
                             local_b8.m_filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_path._M_dataplus._M_p != &local_b8.m_path.field_2) {
    operator_delete(local_b8.m_path._M_dataplus._M_p,
                    CONCAT71(local_b8.m_path.field_2._M_allocated_capacity._1_7_,
                             local_b8.m_path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool ReadDSC(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    // ToDo: std::string for file extension
    std::string strPath = file.path();
    MemFile file2;
    MemFile* pfileHeader = &file, * pfileData = &file2;

    // If we've been given the header, open the data file
    if (IsFileExt(strPath, "hdr"))
    {
        // HDR->DSC (preserving case)
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'D' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'S' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'C' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .dsc companion file");
    }
    // Or if given the data file, switch to the header
    else if (IsFileExt(strPath, "dsc"))
    {
        // DSC->HDR
        size_t offset = strPath.length() - 3;
        strPath[offset + 0] = 'H' | (strPath[offset + 0] & 0x20);
        strPath[offset + 1] = 'D' | (strPath[offset + 1] & 0x20);
        strPath[offset + 2] = 'R' | (strPath[offset + 2] & 0x20);

        if (!file2.open(strPath))
            throw util::exception("missing .hdr companion file");

        std::swap(pfileHeader, pfileData);
    }
    // Reject other file extensions
    else
        return false;

    for (;;)
    {
        DSC_TRACK dh;
        if (!pfileHeader->read(&dh, sizeof(dh)))
            break;

        Track track;
        CylHead cylhead(dh.cyl, dh.head);

        for (int i = 0; i < dh.sectors; ++i)
        {
            DSC_SECTOR ds;
            if (!pfileHeader->read(&ds, sizeof(ds), 1))
                throw util::exception("short file reading %s", CHS(cylhead.cyl, cylhead.head, i));

            Sector sector(DataRate::_250K, Encoding::MFM, Header(ds.cyl, ds.head, ds.sector, ds.size));

            if (ds.flags & ~0x02)
                Message(msgWarning, "unknown flags [%02X] for %s", ds.flags & ~0x02, CHSR(cylhead.cyl, cylhead.head, i, ds.sector));

            // b1 of flags indicates fill byte
            if (ds.flags & 0x02)
                sector.add(Data(sector.size(), ds.fill));
            else
            {
                DSC_DATA dd;
                if (!pfileHeader->read(&dd, sizeof(dd)))
                    throw util::exception("short file reading ", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));

                auto offset = (dd.bOff16M << 24) | (dd.bOff64K << 16) | (dd.bOff256 << 8);
                if (offset != pfileData->tell())
                    Message(msgWarning, "header offset (%lu) != data pointer (%lu)", offset, pfileData->tell());

                Data data(sector.size());
                if (!pfileData->read(data))
                    throw util::exception("short file reading %s data", CHSR(cylhead.cyl, cylhead.head, i, sector.header.sector));
                sector.add(std::move(data));
            }

            track.add(std::move(sector));
        }

        disk->write(cylhead, std::move(track));
    }

    disk->strType = "DSC";
    return true;
}